

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall Lexer::copy_str(Lexer *this,string *dst,int32_t dst_index)

{
  pointer pcVar1;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pcVar1 = (this->code_ptr)._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)local_40,pcVar1 + (this->current_index).index,pcVar1 + dst_index);
  std::__cxx11::string::operator=((string *)dst,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  (this->current_index).index = dst_index;
  return;
}

Assistant:

void Lexer::copy_str(string &dst, int32_t dst_index) {
//    if (!dst.length())return;
    dst = string(code_ptr.begin() + current_index.index, code_ptr.begin() + dst_index);
    current_index.index = dst_index;
}